

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImg<float>::CImg<unsigned_char>(CImg<float> *this,CImg<unsigned_char> *img)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  CImg<unsigned_char> *in_RSI;
  CImg<float> *in_RDI;
  float *ptrd;
  uchar *ptrs;
  uint siz;
  float *local_60;
  uchar *local_58;
  
  in_RDI->_is_shared = false;
  uVar2 = cimg_library::CImg<unsigned_char>::size(in_RSI);
  if ((in_RSI->_data == (uchar *)0x0) || (uVar2 == 0)) {
    in_RDI->_spectrum = 0;
    in_RDI->_depth = 0;
    in_RDI->_height = 0;
    in_RDI->_width = 0;
    in_RDI->_data = (float *)0x0;
  }
  else {
    in_RDI->_width = in_RSI->_width;
    in_RDI->_height = in_RSI->_height;
    in_RDI->_depth = in_RSI->_depth;
    in_RDI->_spectrum = in_RSI->_spectrum;
    pfVar4 = (float *)operator_new__((ulong)uVar2 << 2);
    in_RDI->_data = pfVar4;
    puVar1 = in_RSI->_data;
    pfVar4 = in_RDI->_data;
    uVar3 = size(in_RDI);
    local_60 = pfVar4 + uVar3;
    local_58 = puVar1 + uVar2;
    while (in_RDI->_data < local_60) {
      local_60[-1] = (float)local_58[-1];
      local_60 = local_60 + -1;
      local_58 = local_58 + -1;
    }
  }
  return;
}

Assistant:

CImg(const CImg<t>& img):_is_shared(false) {
      const unsigned int siz = img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum;
        try { _data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "CImg() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(img._width*img._height*img._depth*img._spectrum*sizeof(T)),
                                      img._width,img._height,img._depth,img._spectrum);
        }
        const t *ptrs = img._data + siz; cimg_for(*this,ptrd,T) *ptrd = (T)*(--ptrs);
      } else { _width = _height = _depth = _spectrum = 0; _data = 0; }
    }